

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall HSlider::on_mouse_button_hold(HSlider *this,int mx,int my)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  int in_ESI;
  Widget *in_RDI;
  double r;
  double local_28;
  double local_20;
  double local_18;
  int local_c;
  
  local_c = in_ESI;
  uVar1 = (*in_RDI->_vptr_Widget[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = in_RDI->x1;
    uVar2 = Widget::width(in_RDI);
    local_18 = (double)(int)(~uVar1 + local_c) / (double)(uVar2 - 2);
    local_20 = 0.0;
    local_28 = 1.0;
    pdVar3 = std::min<double>(&local_18,&local_28);
    pdVar3 = std::max<double>(&local_20,pdVar3);
    local_18 = *pdVar3;
    *(int *)&in_RDI->field_0x34 = (int)(local_18 * (double)*(int *)&in_RDI[1]._vptr_Widget);
    Dialog::request_draw(in_RDI->dialog);
  }
  return;
}

Assistant:

void HSlider::on_mouse_button_hold(int mx, int my)
{
   if (is_disabled())
      return;

   double r = (double) (mx - 1 - this->x1) / (this->width() - 2);
   r = CLAMP(0.0, r, 1.0);
   cur_value = (int) (r * max_value);
   dialog->request_draw();

   (void)my;
}